

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

bool __thiscall NaPNDelay::activate(NaPNDelay *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  NaPetriNode *in_RDI;
  uint i;
  uint5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar4;
  NaPNDelay *in_stack_ffffffffffffffe0;
  uint local_c;
  
  bVar1 = awake(in_stack_ffffffffffffffe0);
  *(bool *)((long)&in_RDI[5].pcaPorts.pTail + 4) = bVar1;
  if ((((ulong)in_RDI[5].pcaPorts.pTail & 0x100000000) != 0) &&
     (uVar2 = (*in_RDI->_vptr_NaPetriNode[3])(), (uVar2 & 1) != 0)) {
    pcVar3 = NaPetriNode::name(in_RDI);
    uVar2 = NaPetriNode::activations(in_RDI);
    NaPrintLog("node \'%s\' is awaken: activations=%d, delay=",pcVar3,(ulong)uVar2);
    for (local_c = 0; local_c < *(uint *)&in_RDI[6].pcaPorts._vptr_NaDynAr; local_c = local_c + 1) {
      if (local_c + 1 == *(int *)&in_RDI[6].pcaPorts._vptr_NaDynAr) {
        NaPrintLog("%d\n",(ulong)*(uint *)((long)&(in_RDI[6].pNet)->_vptr_NaPetriNet +
                                          (ulong)local_c * 4));
      }
      else {
        NaPrintLog("%d,",(ulong)*(uint *)((long)&(in_RDI[6].pNet)->_vptr_NaPetriNet +
                                         (ulong)local_c * 4));
      }
    }
  }
  bVar1 = NaPetriCnInput::is_waiting
                    ((NaPetriCnInput *)
                     CONCAT17(in_stack_ffffffffffffffdf,
                              CONCAT16(in_stack_ffffffffffffffde,
                                       CONCAT15(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffd8)
                                      )));
  bVar4 = 0;
  if (((!bVar1) && (bVar4 = 1, ((ulong)in_RDI[5].pcaPorts.pTail & 0x100000000) != 0)) &&
     (bVar4 = 0, ((ulong)in_RDI[5].pcaPorts.pTail & 0x100000000) != 0)) {
    bVar1 = NaPetriCnOutput::is_waiting
                      ((NaPetriCnOutput *)(ulong)CONCAT16(1,(uint6)in_stack_ffffffffffffffd8));
    bVar4 = bVar1 ^ 0xff;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool
NaPNDelay::activate ()
{
  // For action() and post_action() only
  bAwaken = awake();

  if(bAwaken && is_verbose())
    {
      unsigned	i;
      NaPrintLog("node '%s' is awaken: activations=%d, delay=",
		 name(), activations());
      for(i = 0; i < nOutDim; ++i)
	if(i + 1 == nOutDim)
	  NaPrintLog("%d\n", piOutMap[i]);
	else
	  NaPrintLog("%d,", piOutMap[i]);
    }

  // Does not depend on bAwaken state and output state, so 
  return !in.is_waiting() &&
    (!bAwaken || (bAwaken && !dout.is_waiting()));
}